

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O3

void raviX_ptrlist_remove_all(PtrList **self)

{
  PtrList *pPVar1;
  PtrList *pPVar2;
  
  pPVar2 = *self;
  if (pPVar2 != (PtrList *)0x0) {
    pPVar2->prev_->next_ = (PtrList *)0x0;
    do {
      pPVar1 = pPVar2->next_;
      (*pPVar2->allocator_->free)(pPVar2->allocator_->arena,pPVar2);
      pPVar2 = pPVar1;
    } while (pPVar1 != (PtrList *)0x0);
    *self = (PtrList *)0x0;
  }
  return;
}

Assistant:

void raviX_ptrlist_remove_all(PtrList **self)
{
	PtrList *tmp, *list = *self;
	if (!list)
		return;
	list->prev_->next_ = NULL;
	while (list) {
		tmp = list;
		list = list->next_;
		C_MemoryAllocator *alloc = tmp->allocator_;
		alloc->free(alloc->arena, tmp);
	}
	*self = NULL;
}